

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O0

void Fra_FraigNode(Fra_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *p_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int RetValue;
  Aig_Obj_t *pObjReprFraig;
  Aig_Obj_t *pObjFraig2;
  Aig_Obj_t *pObjFraig;
  Aig_Obj_t *pObjRepr;
  Aig_Obj_t *pObj_local;
  Fra_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraCore.c"
                  ,0xee,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
  }
  pAVar2 = Fra_ClassObjRepr(pObj);
  if ((pAVar2 != (Aig_Obj_t *)0x0) &&
     ((p->pPars->fDoSparse != 0 || (pAVar3 = Aig_ManConst1(p->pManAig), pAVar2 != pAVar3)))) {
    pAVar3 = Fra_ObjFraig(pObj,p->pPars->nFramesK);
    p_00 = Fra_ObjFraig(pAVar2,p->pPars->nFramesK);
    pAVar4 = Aig_Regular(pAVar3);
    pAVar5 = Aig_Regular(p_00);
    if (pAVar4 == pAVar5) {
      p->nSatCallsSkipped = p->nSatCallsSkipped + 1;
    }
    else {
      if (p->pPars->nFramesK == 0) {
        pAVar4 = Aig_Regular(pAVar3);
        pAVar5 = Aig_ManConst1(p->pManFraig);
        if (pAVar4 == pAVar5) {
          __assert_fail("p->pPars->nFramesK || Aig_Regular(pObjFraig) != Aig_ManConst1(p->pManFraig)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraCore.c"
                        ,0xfe,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
        }
      }
      pAVar4 = Aig_Regular(p_00);
      pAVar3 = Aig_Regular(pAVar3);
      iVar1 = Fra_NodesAreEquiv(p,pAVar4,pAVar3);
      if (iVar1 == 1) {
        pAVar2 = Aig_NotCond(p_00,(uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1 ^
                                  (uint)(*(ulong *)&pAVar2->field_0x18 >> 3) & 1);
        Fra_ObjSetFraig(pObj,p->pPars->nFramesK,pAVar2);
      }
      else if (iVar1 == -1) {
        if (p->vTimeouts == (Vec_Ptr_t *)0x0) {
          pVVar6 = Vec_PtrAlloc(100);
          p->vTimeouts = pVVar6;
        }
        Vec_PtrPush(p->vTimeouts,pObj);
        if (p->pPars->fSpeculate != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraCore.c"
                        ,0x111,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
        }
      }
      else {
        p->pCla->fRefinement = 1;
        if (p->vTimeouts != (Vec_Ptr_t *)0x0) {
          Vec_PtrPush(p->vTimeouts,pObj);
        }
        Fra_SmlResimulate(p);
        if (p->pManFraig->pData == (void *)0x0) {
          if ((p->pPars->nFramesK == 0) && (pAVar3 = Fra_ClassObjRepr(pObj), pAVar3 == pAVar2)) {
            printf("Fra_FraigNode(): Error in class refinement!\n");
          }
          if ((p->pPars->nFramesK == 0) && (pAVar3 = Fra_ClassObjRepr(pObj), pAVar3 == pAVar2)) {
            __assert_fail("p->pPars->nFramesK || Fra_ClassObjRepr(pObj) != pObjRepr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraCore.c"
                          ,0x128,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Fra_FraigNode( Fra_Man_t * p, Aig_Obj_t * pObj )
{ 
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    assert( !Aig_IsComplement(pObj) );
    // get representative of this class
    pObjRepr = Fra_ClassObjRepr( pObj );
    if ( pObjRepr == NULL || // this is a unique node
       (!p->pPars->fDoSparse && pObjRepr == Aig_ManConst1(p->pManAig)) ) // this is a sparse node
        return;
    // get the fraiged node
    pObjFraig = Fra_ObjFraig( pObj, p->pPars->nFramesK );
    // get the fraiged representative
    pObjReprFraig = Fra_ObjFraig( pObjRepr, p->pPars->nFramesK );
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
    {
        p->nSatCallsSkipped++;
        return;
    }
    assert( p->pPars->nFramesK || Aig_Regular(pObjFraig) != Aig_ManConst1(p->pManFraig) );
    // if they are proved different, the c-ex will be in p->pPatWords
    RetValue = Fra_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    if ( RetValue == 1 )  // proved equivalent
    {
//        if ( p->pPars->fChoicing )
//            Aig_ObjCreateRepr( p->pManFraig, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
        // the nodes proved equal
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjFraig2 );
        return;
    }
    if ( RetValue == -1 ) // failed
    {
        if ( p->vTimeouts == NULL )
            p->vTimeouts = Vec_PtrAlloc( 100 );
        Vec_PtrPush( p->vTimeouts, pObj );
        if ( !p->pPars->fSpeculate )
            return;
        assert( 0 );
        // speculate
        p->nSpeculs++;
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjFraig2 );
        Fra_FraigNodeSpeculate( p, pObj, Aig_Regular(pObjFraig), Aig_Regular(pObjReprFraig) );
        return;
    }
    // disprove the nodes
    p->pCla->fRefinement = 1;
    // if we do not include the node into those disproved, we may end up 
    // merging this node with another representative, for which proof has timed out
    if ( p->vTimeouts )
        Vec_PtrPush( p->vTimeouts, pObj );
    // verify that the counter-example satisfies all the constraints
//    if ( p->vCex )
//        Fra_FraigVerifyCounterEx( p, p->vCex );
    // simulate the counter-example and return the Fraig node
    Fra_SmlResimulate( p );
    if ( p->pManFraig->pData )
        return;
    if ( !p->pPars->nFramesK && Fra_ClassObjRepr(pObj) == pObjRepr )
        printf( "Fra_FraigNode(): Error in class refinement!\n" );
    assert( p->pPars->nFramesK || Fra_ClassObjRepr(pObj) != pObjRepr );
}